

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O3

void __thiscall CP::vector<int>::uniq(vector<int> *this)

{
  int *piVar1;
  size_t sVar2;
  iterator iVar3;
  unsigned_long __tmp;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  vector<int> tmp;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> s;
  vector<int> local_88;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_70;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_88.mData = (int *)operator_new__(4);
  *local_88.mData = 0;
  local_88.mCap = 1;
  local_88.mSize = 0;
  if (this->mSize == 0) {
    local_88.mCap._0_4_ = 1;
    local_88.mCap._4_4_ = 0;
    local_88.mSize._0_4_ = 0;
    local_88.mSize._4_4_ = 0;
    uVar4 = 0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    do {
      iVar3 = std::
              _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&local_68,(key_type *)((long)this->mData + lVar6));
      if (iVar3.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
        local_70 = &local_68;
        std::
        _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                  ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_68,(long)this->mData + lVar6,&local_70);
        insert(&local_88,local_88.mData + local_88.mSize,(int *)((long)this->mData + lVar6));
      }
      uVar5 = uVar5 + 1;
      uVar4 = this->mSize;
      lVar6 = lVar6 + 4;
    } while (uVar5 < uVar4);
  }
  piVar1 = this->mData;
  this->mData = local_88.mData;
  sVar2 = this->mCap;
  *(undefined4 *)&this->mCap = (undefined4)local_88.mCap;
  *(undefined4 *)((long)&this->mCap + 4) = local_88.mCap._4_4_;
  *(undefined4 *)&this->mSize = (undefined4)local_88.mSize;
  *(undefined4 *)((long)&this->mSize + 4) = local_88.mSize._4_4_;
  local_88.mData = piVar1;
  local_88.mCap = sVar2;
  local_88.mSize = uVar4;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void CP::vector<T>::uniq() {
  //do someting here
  std::unordered_set<T> s;
  CP::vector<T> tmp;
  for (int i = 0; i < mSize; ++i) {
    if (s.find(mData[i]) == s.end()) {
      s.insert(mData[i]);
      tmp.push_back(mData[i]);
    }
  }
  std::swap(mData, tmp.mData);
  std::swap(mSize, tmp.mSize);
  std::swap(mCap, tmp.mCap);
}